

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O2

void __thiscall
cbt2DarcShape::getAabb(cbt2DarcShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined8 uVar8;
  undefined1 auVar6 [16];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [64];
  cbtVector3 cVar12;
  cbtMatrix3x3 abs_b;
  float local_98;
  cbtVector3 local_80;
  cbtVector3 local_70;
  uint local_60;
  float local_5c;
  uint local_58;
  uint local_50;
  float local_4c;
  uint local_48;
  uint local_40;
  float local_3c;
  uint local_38;
  undefined1 auVar11 [56];
  
  auVar11 = in_ZMM1._8_56_;
  fVar4 = this->radius;
  fVar5 = this->zthickness * 0.5;
  cbtMatrix3x3::absolute(&t->m_basis);
  local_80.m_floats._0_8_ = *(undefined8 *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar9 = ZEXT856(0);
  local_80.m_floats[2] = 0.0;
  local_80.m_floats[3] = 0.0;
  cVar12 = ::operator*(&t->m_basis,&local_80);
  auVar10._0_8_ = cVar12.m_floats._8_8_;
  auVar10._8_56_ = auVar11;
  auVar7._0_8_ = cVar12.m_floats._0_8_;
  auVar7._8_56_ = auVar9;
  local_70.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
  uVar8 = local_70.m_floats._8_8_;
  cVar12 = ::operator+(&t->m_origin,&local_70);
  auVar6 = ZEXT416((uint)fVar4);
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_5c)),auVar6,ZEXT416(local_60));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_4c)),auVar6,ZEXT416(local_50));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_3c)),auVar6,ZEXT416(local_40));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar5),ZEXT416(local_58));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar5),ZEXT416(local_48));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar5),ZEXT416(local_38));
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar5 = fVar4;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar5 = fVar5 + auVar3._0_4_;
  auVar3._8_8_ = uVar8;
  auVar3._0_8_ = cVar12.m_floats._0_8_;
  fVar1 = auVar6._0_4_ + 0.0;
  local_98 = cVar12.m_floats[2];
  fVar4 = fVar4 + auVar2._0_4_;
  auVar3 = vmovshdup_avx(auVar3);
  auVar2 = vinsertps_avx(ZEXT416((uint)(cVar12.m_floats[0] - fVar4)),
                         ZEXT416((uint)(auVar3._0_4_ - fVar5)),0x10);
  auVar3 = vinsertps_avx(ZEXT416((uint)(cVar12.m_floats[0] + fVar4)),
                         ZEXT416((uint)(auVar3._0_4_ + fVar5)),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)(local_98 - fVar1)),0x28);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(local_98 + fVar1)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar2;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar3;
  return;
}

Assistant:

void cbt2DarcShape::getAabb(const cbtTransform& t,cbtVector3& aabbMin,cbtVector3& aabbMax) const
{
	cbtVector3 halfExtents; 
	halfExtents.setValue((radius), 
						 (radius),
						 (zthickness*0.5f));

	cbtMatrix3x3 abs_b = t.getBasis().absolute();  
	cbtVector3 center = t.getOrigin()+ t.getBasis()*cbtVector3(this->x, this->y, 0);
	cbtVector3 extent = cbtVector3(abs_b[0].dot(halfExtents),
		   abs_b[1].dot(halfExtents),
		  abs_b[2].dot(halfExtents));
	extent += cbtVector3(getMargin(),getMargin(),0);

	aabbMin = center - extent;
	aabbMax = center + extent;

}